

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O3

void __thiscall gutil::Parameter::nextString(Parameter *this,string *s,char *opt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_t sVar3;
  long *plVar4;
  ulong uVar5;
  IOException *pIVar6;
  size_type *psVar7;
  string p;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar5 = this->pos;
  if ((ulong)((long)(this->list).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->list).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar5) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"There are no more values!","");
    IOException::IOException(pIVar6,&local_70);
    __cxa_throw(pIVar6,&IOException::typeinfo,Exception::~Exception);
  }
  if (opt != (char *)0x0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar3 = strlen(opt);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,opt,opt + sVar3);
    plVar4 = (long *)std::__cxx11::string::insert((ulong)&local_90,0,'\x01');
    paVar1 = &local_b0.field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0.field_2._8_8_ = plVar4[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_b0,local_b0._M_string_length,0,'\x01');
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70.field_2._8_8_ = plVar4[3];
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_70._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    std::operator+(&local_90,'|',
                   (this->list).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + this->pos);
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_90,local_90._M_string_length,0,'\x01');
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0.field_2._8_8_ = plVar4[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar5 = std::__cxx11::string::find((char *)&local_70,(ulong)local_b0._M_dataplus._M_p,0);
    sVar2 = local_70._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (sVar2 <= uVar5) {
      pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_50,"Argument \'",
                     (this->list).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->pos);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar7) {
        local_90.field_2._M_allocated_capacity = *psVar7;
        local_90.field_2._8_8_ = plVar4[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar7;
      }
      local_90._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar7) {
        local_b0.field_2._M_allocated_capacity = *psVar7;
        local_b0.field_2._8_8_ = plVar4[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar7;
      }
      local_b0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      IOException::IOException(pIVar6,&local_b0);
      __cxa_throw(pIVar6,&IOException::typeinfo,Exception::~Exception);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    uVar5 = this->pos;
  }
  this->pos = uVar5 + 1;
  std::__cxx11::string::_M_assign((string *)s);
  return;
}

Assistant:

void Parameter::nextString(std::string &s, const char *opt)
{
  if (pos < list.size())
  {
    if (opt != 0)
    {
      std::string p='|'+std::string(opt)+'|';

      if (p.find('|'+list[pos]+'|') >= p.size())
      {
        throw IOException("Argument '"+list[pos]+"' must be one of: "+opt);
      }
    }

    s=list[pos++];
  }
  else
  {
    throw IOException("There are no more values!");
  }
}